

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall
leveldb::RecoveryTest_LargeManifestCompacted_Test::TestBody
          (RecoveryTest_LargeManifestCompacted_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DB *pDVar3;
  Env *pEVar4;
  undefined8 *puVar5;
  AssertHelperData *pAVar6;
  char cVar7;
  size_type sVar8;
  bool bVar9;
  uint64_t uVar10;
  int iVar11;
  AssertHelper *pAVar12;
  _Alloc_hider _Var13;
  string *this_00;
  char *pcVar14;
  AssertionResult gtest_ar;
  WritableFile *file;
  AssertionResult gtest_ar_3;
  string new_manifest;
  string old_manifest;
  string local_d0;
  undefined1 local_b0 [24];
  string local_98;
  AssertHelper local_78;
  string local_70;
  string local_50;
  
  bVar9 = RecoveryTest::CanAppend(&this->super_RecoveryTest);
  if (!bVar9) {
    TestBody();
    return;
  }
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"foo","");
  pAVar6 = (AssertHelperData *)((long)&local_70 + 0x10);
  local_70._M_dataplus._M_p = (pointer)pAVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"bar","");
  local_78.data_._0_1_ = 0;
  local_d0._M_dataplus._M_p = local_50._M_dataplus._M_p;
  local_d0._M_string_length = local_50._M_string_length;
  local_98._M_dataplus._M_p = local_70._M_dataplus._M_p;
  local_98._M_string_length._0_4_ = (undefined4)local_70._M_string_length;
  local_98._M_string_length._4_4_ = local_70._M_string_length._4_4_;
  (*((this->super_RecoveryTest).db_)->_vptr_DB[2])(local_b0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_d0,local_b0 + 0x18,
             (Status *)"Put(\"foo\", \"bar\")");
  if ((void *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
  }
  if ((AssertHelperData *)local_70._M_dataplus._M_p != pAVar6) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  cVar7 = (char)local_d0._M_dataplus._M_p;
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((pointer)local_d0._M_string_length == (pointer)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0xb8,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  sVar8 = local_d0._M_string_length;
  if ((pointer)local_d0._M_string_length != (pointer)0x0) {
    if (*(pointer *)local_d0._M_string_length != (pointer)(local_d0._M_string_length + 0x10)) {
      operator_delete(*(pointer *)local_d0._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  if (cVar7 == '\0') {
    return;
  }
  pDVar3 = (this->super_RecoveryTest).db_;
  if (pDVar3 != (DB *)0x0) {
    (*pDVar3->_vptr_DB[1])();
  }
  (this->super_RecoveryTest).db_ = (DB *)0x0;
  RecoveryTest::ManifestFileName_abi_cxx11_(&local_50,&this->super_RecoveryTest);
  uVar10 = RecoveryTest::FileSize(&this->super_RecoveryTest,&local_50);
  pEVar4 = (this->super_RecoveryTest).env_;
  (*pEVar4->_vptr_Env[5])(&local_d0,pEVar4,&local_50,local_b0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_70,local_b0 + 0x18,
             (Status *)"env()->NewAppendableFile(old_manifest, &file)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_d0._M_dataplus._M_p);
  }
  if (local_70._M_dataplus._M_p._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)
        CONCAT44(local_70._M_string_length._4_4_,(undefined4)local_70._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)CONCAT44(local_70._M_string_length._4_4_,
                                   (undefined4)local_70._M_string_length);
    }
    pAVar12 = (AssertHelper *)(local_b0 + 0x18);
    testing::internal::AssertHelper::AssertHelper
              (pAVar12,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0xc0,pcVar14);
    testing::internal::AssertHelper::operator=(pAVar12,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(pAVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d0._M_dataplus._M_p + 8))();
    }
    _Var13._M_p = (pointer)CONCAT44(local_70._M_string_length._4_4_,
                                    (undefined4)local_70._M_string_length);
    if ((AssertHelperData *)_Var13._M_p == (AssertHelperData *)0x0) goto LAB_0010bde4;
    if (*(long **)_Var13._M_p != (long *)&((AssertHelperData *)_Var13._M_p)->line) {
      operator_delete(*(long **)_Var13._M_p);
    }
  }
  else {
    puVar5 = (undefined8 *)
             CONCAT44(local_70._M_string_length._4_4_,(undefined4)local_70._M_string_length);
    if (puVar5 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar5 != puVar5 + 2) {
        operator_delete((undefined8 *)*puVar5);
      }
      operator_delete(puVar5);
    }
    local_70._M_dataplus._M_p = (pointer)pAVar6;
    std::__cxx11::string::_M_construct((ulong)&local_70,-(char)uVar10);
    local_98._M_dataplus._M_p = local_70._M_dataplus._M_p;
    local_98._M_string_length._0_4_ = (undefined4)local_70._M_string_length;
    local_98._M_string_length._4_4_ = local_70._M_string_length._4_4_;
    (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 0x10))(&local_78);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_d0,
               local_b0 + 0x17,(Status *)"file->Append(zeroes)");
    if ((void *)CONCAT71(local_78.data_._1_7_,local_78.data_._0_1_) != (void *)0x0) {
      operator_delete__((void *)CONCAT71(local_78.data_._1_7_,local_78.data_._0_1_));
    }
    sVar8 = local_d0._M_string_length;
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)(local_b0 + 0x18));
      if ((pointer)local_d0._M_string_length == (pointer)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)local_d0._M_string_length;
      }
      pAVar12 = &local_78;
      iVar11 = 0xc2;
LAB_0010bd87:
      testing::internal::AssertHelper::AssertHelper
                (pAVar12,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                 ,iVar11,pcVar14);
      testing::internal::AssertHelper::operator=(pAVar12,(Message *)(local_b0 + 0x18));
      testing::internal::AssertHelper::~AssertHelper(pAVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
      }
      sVar8 = local_d0._M_string_length;
      if ((pointer)local_d0._M_string_length != (pointer)0x0) {
        if (*(pointer *)local_d0._M_string_length != (pointer)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(pointer *)local_d0._M_string_length);
        }
        operator_delete((void *)sVar8);
      }
    }
    else {
      if ((pointer)local_d0._M_string_length != (pointer)0x0) {
        if (*(pointer *)local_d0._M_string_length != (pointer)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(pointer *)local_d0._M_string_length);
        }
        operator_delete((void *)sVar8);
      }
      (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 0x20))(local_b0 + 0x18);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_d0,
                 (char *)&local_78,(Status *)"file->Flush()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_98._M_dataplus._M_p);
      }
      sVar8 = local_d0._M_string_length;
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)(local_b0 + 0x18));
        if ((pointer)local_d0._M_string_length == (pointer)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)local_d0._M_string_length;
        }
        pAVar12 = &local_78;
        iVar11 = 0xc3;
        goto LAB_0010bd87;
      }
      if ((pointer)local_d0._M_string_length != (pointer)0x0) {
        if (*(pointer *)local_d0._M_string_length != (pointer)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(pointer *)local_d0._M_string_length);
        }
        operator_delete((void *)sVar8);
      }
      if ((long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 8))();
      }
      if ((AssertHelperData *)local_70._M_dataplus._M_p != pAVar6) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
      RecoveryTest::ManifestFileName_abi_cxx11_(&local_70,&this->super_RecoveryTest);
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&local_d0,"old_manifest","new_manifest",&local_50,&local_70);
      sVar8 = local_d0._M_string_length;
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)(local_b0 + 0x18));
        if ((pointer)local_d0._M_string_length == (pointer)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)local_d0._M_string_length;
        }
        pAVar12 = (AssertHelper *)local_b0;
        iVar11 = 0xc9;
        goto LAB_0010bd87;
      }
      if ((pointer)local_d0._M_string_length != (pointer)0x0) {
        if (*(pointer *)local_d0._M_string_length != (pointer)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(pointer *)local_d0._M_string_length);
        }
        operator_delete((void *)sVar8);
      }
      local_b0._0_4_ = 10000;
      local_98._M_dataplus._M_p =
           (pointer)RecoveryTest::FileSize(&this->super_RecoveryTest,&local_70);
      testing::internal::CmpHelperGT<int,unsigned_long>
                ((internal *)&local_d0,"10000","FileSize(new_manifest)",(int *)local_b0,
                 (unsigned_long *)(local_b0 + 0x18));
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)(local_b0 + 0x18));
        if ((pointer)local_d0._M_string_length == (pointer)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                   ,0xca,pcVar14);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)local_b0,(Message *)(local_b0 + 0x18));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
        }
        this_00 = &local_d0;
      }
      else {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_d0);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_b0 + 0x18),"foo","");
        RecoveryTest::Get(&local_d0,&this->super_RecoveryTest,(string *)(local_b0 + 0x18),
                          (Snapshot *)0x0);
        testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                  ((internal *)local_b0,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",&local_d0);
        paVar1 = &local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (local_b0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d0);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_b0._8_8_ ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar14 = "";
          }
          else {
            pcVar14 = *(char **)local_b0._8_8_;
          }
          iVar11 = 0xcb;
LAB_0010beaf:
          pAVar12 = (AssertHelper *)(local_b0 + 0x18);
          testing::internal::AssertHelper::AssertHelper
                    (pAVar12,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                     ,iVar11,pcVar14);
          testing::internal::AssertHelper::operator=(pAVar12,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(pAVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_d0._M_dataplus._M_p + 8))();
          }
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
          RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
          RecoveryTest::ManifestFileName_abi_cxx11_(&local_d0,&this->super_RecoveryTest);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)(local_b0 + 0x18),"new_manifest","ManifestFileName()",&local_70,
                     &local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if (local_98._M_dataplus._M_p._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_d0);
            if ((undefined8 *)
                CONCAT44(local_98._M_string_length._4_4_,(undefined4)local_98._M_string_length) ==
                (undefined8 *)0x0) {
              pcVar14 = "";
            }
            else {
              pcVar14 = *(char **)CONCAT44(local_98._M_string_length._4_4_,
                                           (undefined4)local_98._M_string_length);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                       ,0xce,pcVar14);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_b0,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_d0._M_dataplus._M_p + 8))();
            }
            this_00 = (string *)(local_b0 + 0x18);
            goto LAB_0010bf31;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)(local_b0 + 0x18));
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_b0 + 0x18),"foo","");
          RecoveryTest::Get(&local_d0,&this->super_RecoveryTest,(string *)(local_b0 + 0x18),
                            (Snapshot *)0x0);
          testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                    ((internal *)local_b0,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if (local_b0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar14 = "";
            }
            else {
              pcVar14 = ((_Alloc_hider *)local_b0._8_8_)->_M_p;
            }
            iVar11 = 0xcf;
            goto LAB_0010beaf;
          }
        }
        this_00 = (string *)local_b0;
      }
LAB_0010bf31:
      testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
    }
    _Var13._M_p = local_70._M_dataplus._M_p;
    if ((AssertHelperData *)local_70._M_dataplus._M_p == pAVar6) goto LAB_0010bde4;
  }
  operator_delete(_Var13._M_p);
LAB_0010bde4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(RecoveryTest, LargeManifestCompacted) {
  if (!CanAppend()) {
    std::fprintf(stderr,
                 "skipping test because env does not support appending\n");
    return;
  }
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  Close();
  std::string old_manifest = ManifestFileName();

  // Pad with zeroes to make manifest file very big.
  {
    uint64_t len = FileSize(old_manifest);
    WritableFile* file;
    ASSERT_LEVELDB_OK(env()->NewAppendableFile(old_manifest, &file));
    std::string zeroes(3 * 1048576 - static_cast<size_t>(len), 0);
    ASSERT_LEVELDB_OK(file->Append(zeroes));
    ASSERT_LEVELDB_OK(file->Flush());
    delete file;
  }

  Open();
  std::string new_manifest = ManifestFileName();
  ASSERT_NE(old_manifest, new_manifest);
  ASSERT_GT(10000, FileSize(new_manifest));
  ASSERT_EQ("bar", Get("foo"));

  Open();
  ASSERT_EQ(new_manifest, ManifestFileName());
  ASSERT_EQ("bar", Get("foo"));
}